

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Select * sqlite3SelectNew(Parse *pParse,ExprList *pEList,SrcList *pSrc,Expr *pWhere,
                         ExprList *pGroupBy,Expr *pHaving,ExprList *pOrderBy,u32 selFlags,
                         Expr *pLimit,Expr *pOffset)

{
  Expr *pExpr;
  undefined1 local_b0 [8];
  Select standin;
  Select *pNew;
  Expr *pHaving_local;
  ExprList *pGroupBy_local;
  Expr *pWhere_local;
  SrcList *pSrc_local;
  ExprList *pEList_local;
  Parse *pParse_local;
  
  standin.pWith = (With *)sqlite3DbMallocRawNN(pParse->db,0x70);
  if (standin.pWith == (With *)0x0) {
    standin.pWith = (With *)local_b0;
  }
  pSrc_local = (SrcList *)pEList;
  if (pEList == (ExprList *)0x0) {
    pExpr = sqlite3Expr(pParse->db,0xa1,(char *)0x0);
    pSrc_local = (SrcList *)sqlite3ExprListAppend(pParse,(ExprList *)0x0,pExpr);
  }
  *(SrcList **)standin.pWith = pSrc_local;
  *(undefined1 *)&(standin.pWith)->pOuter = 0x77;
  *(u32 *)((long)&(standin.pWith)->pOuter + 4) = selFlags;
  *(undefined4 *)&(standin.pWith)->a[0].zName = 0;
  *(undefined4 *)((long)&(standin.pWith)->a[0].zName + 4) = 0;
  *(undefined4 *)&(standin.pWith)->a[0].pCols = 0xffffffff;
  *(undefined4 *)((long)&(standin.pWith)->a[0].pCols + 4) = 0xffffffff;
  *(undefined2 *)((long)&(standin.pWith)->pOuter + 2) = 0;
  pWhere_local = (Expr *)pSrc;
  if (pSrc == (SrcList *)0x0) {
    pWhere_local = (Expr *)sqlite3DbMallocZero(pParse->db,0x78);
  }
  (standin.pWith)->a[0].pSelect = (Select *)pWhere_local;
  (standin.pWith)->a[0].zCteErr = (char *)pWhere;
  *(ExprList **)(standin.pWith + 1) = pGroupBy;
  standin.pWith[1].pOuter = (With *)pHaving;
  standin.pWith[1].a[0].zName = (char *)pOrderBy;
  standin.pWith[1].a[0].pCols = (ExprList *)0x0;
  standin.pWith[1].a[0].pSelect = (Select *)0x0;
  standin.pWith[1].a[0].zCteErr = (char *)pLimit;
  *(Expr **)(standin.pWith + 2) = pOffset;
  standin.pWith[2].pOuter = (With *)0x0;
  if (pParse->db->mallocFailed != '\0') {
    clearSelect(pParse->db,(Select *)standin.pWith,(uint)(standin.pWith != (With *)local_b0));
    standin.pWith = (With *)0x0;
  }
  return (Select *)standin.pWith;
}

Assistant:

SQLITE_PRIVATE Select *sqlite3SelectNew(
  Parse *pParse,        /* Parsing context */
  ExprList *pEList,     /* which columns to include in the result */
  SrcList *pSrc,        /* the FROM clause -- which tables to scan */
  Expr *pWhere,         /* the WHERE clause */
  ExprList *pGroupBy,   /* the GROUP BY clause */
  Expr *pHaving,        /* the HAVING clause */
  ExprList *pOrderBy,   /* the ORDER BY clause */
  u32 selFlags,         /* Flag parameters, such as SF_Distinct */
  Expr *pLimit,         /* LIMIT value.  NULL means not used */
  Expr *pOffset         /* OFFSET value.  NULL means no offset */
){
  Select *pNew;
  Select standin;
  pNew = sqlite3DbMallocRawNN(pParse->db, sizeof(*pNew) );
  if( pNew==0 ){
    assert( pParse->db->mallocFailed );
    pNew = &standin;
  }
  if( pEList==0 ){
    pEList = sqlite3ExprListAppend(pParse, 0, sqlite3Expr(pParse->db,TK_ASTERISK,0));
  }
  pNew->pEList = pEList;
  pNew->op = TK_SELECT;
  pNew->selFlags = selFlags;
  pNew->iLimit = 0;
  pNew->iOffset = 0;
#if SELECTTRACE_ENABLED
  pNew->zSelName[0] = 0;
#endif
  pNew->addrOpenEphm[0] = -1;
  pNew->addrOpenEphm[1] = -1;
  pNew->nSelectRow = 0;
  if( pSrc==0 ) pSrc = sqlite3DbMallocZero(pParse->db, sizeof(*pSrc));
  pNew->pSrc = pSrc;
  pNew->pWhere = pWhere;
  pNew->pGroupBy = pGroupBy;
  pNew->pHaving = pHaving;
  pNew->pOrderBy = pOrderBy;
  pNew->pPrior = 0;
  pNew->pNext = 0;
  pNew->pLimit = pLimit;
  pNew->pOffset = pOffset;
  pNew->pWith = 0;
  assert( pOffset==0 || pLimit!=0 || pParse->nErr>0 || pParse->db->mallocFailed!=0 );
  if( pParse->db->mallocFailed ) {
    clearSelect(pParse->db, pNew, pNew!=&standin);
    pNew = 0;
  }else{
    assert( pNew->pSrc!=0 || pParse->nErr>0 );
  }
  assert( pNew!=&standin );
  return pNew;
}